

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexInputTests.cpp
# Opt level: O0

bool vkt::pipeline::anon_unknown_0::isSupportedVertexFormat(Context *context,VkFormat format)

{
  bool bVar1;
  VkPhysicalDeviceFeatures *pVVar2;
  InstanceInterface *pIVar3;
  VkPhysicalDevice pVVar4;
  undefined1 local_28 [8];
  VkFormatProperties formatProps;
  VkFormat format_local;
  Context *context_local;
  
  formatProps.optimalTilingFeatures = format;
  unique0x100000b5 = context;
  bVar1 = isVertexFormatDouble(format);
  if ((bVar1) &&
     (pVVar2 = Context::getDeviceFeatures(stack0xffffffffffffffe8), pVVar2->shaderFloat64 == 0)) {
    context_local._7_1_ = false;
  }
  else {
    ::deMemset(local_28,0,0xc);
    pIVar3 = Context::getInstanceInterface(stack0xffffffffffffffe8);
    pVVar4 = Context::getPhysicalDevice(stack0xffffffffffffffe8);
    (*pIVar3->_vptr_InstanceInterface[3])
              (pIVar3,pVVar4,(ulong)formatProps.optimalTilingFeatures,local_28);
    context_local._7_1_ = (formatProps.linearTilingFeatures & 0x40) != 0;
  }
  return context_local._7_1_;
}

Assistant:

bool isSupportedVertexFormat (Context& context, VkFormat format)
{
	if (isVertexFormatDouble(format) && !context.getDeviceFeatures().shaderFloat64)
		return false;

	VkFormatProperties  formatProps;
	deMemset(&formatProps, 0, sizeof(VkFormatProperties));
	context.getInstanceInterface().getPhysicalDeviceFormatProperties(context.getPhysicalDevice(), format, &formatProps);

	return (formatProps.bufferFeatures & VK_FORMAT_FEATURE_VERTEX_BUFFER_BIT) != 0u;
}